

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall pbrt::SpotLight::Phi(SpotLight *this,SampledWavelengths *lambda)

{
  Float a;
  undefined1 auVar5 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  SampledSpectrum local_48;
  SampledSpectrum local_38;
  SampledSpectrum local_28;
  SampledSpectrum local_18;
  
  auVar10 = in_ZMM1._8_56_;
  a = this->scale;
  auVar5 = (undefined1  [56])0x0;
  SVar11 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar6._0_8_ = SVar11.values.values._8_8_;
  auVar6._8_56_ = auVar10;
  auVar1._0_8_ = SVar11.values.values._0_8_;
  auVar1._8_56_ = auVar5;
  local_48.values.values = (array<float,_4>)vmovlhps_avx(auVar1._0_16_,auVar6._0_16_);
  auVar5 = (undefined1  [56])0x0;
  SVar11 = SampledSpectrum::operator*(&local_48,a);
  auVar7._0_8_ = SVar11.values.values._8_8_;
  auVar7._8_56_ = auVar10;
  auVar2._0_8_ = SVar11.values.values._0_8_;
  auVar2._8_56_ = auVar5;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar2._0_16_,auVar7._0_16_);
  auVar5 = (undefined1  [56])0x0;
  SVar11 = SampledSpectrum::operator*(&local_38,2.0);
  auVar8._0_8_ = SVar11.values.values._8_8_;
  auVar8._8_56_ = auVar10;
  auVar3._0_8_ = SVar11.values.values._0_8_;
  auVar3._8_56_ = auVar5;
  local_28.values.values = (array<float,_4>)vmovlhps_avx(auVar3._0_16_,auVar8._0_16_);
  auVar5 = (undefined1  [56])0x0;
  SVar11 = SampledSpectrum::operator*(&local_28,3.1415927);
  auVar9._0_8_ = SVar11.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar4._0_8_ = SVar11.values.values._0_8_;
  auVar4._8_56_ = auVar5;
  local_18.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar9._0_16_);
  SVar11 = SampledSpectrum::operator*
                     (&local_18,
                      (1.0 - this->cosFalloffStart) +
                      (this->cosFalloffStart - this->cosFalloffEnd) * 0.5);
  return (array<float,_4>)(array<float,_4>)SVar11;
}

Assistant:

SampledSpectrum SpotLight::Phi(const SampledWavelengths &lambda) const {
    // int_0^start sin theta dtheta = 1 - cosFalloffStart
    // See notes/sample-spotlight.nb for the falloff part:
    // int_start^end smoothstep(cost, end, start) sin theta dtheta =
    //  (cosStart - cosEnd) / 2
    return scale * I.Sample(lambda) * 2 * Pi *
           ((1 - cosFalloffStart) + (cosFalloffStart - cosFalloffEnd) / 2);
}